

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonGeneration.hpp
# Opt level: O2

string * helics::generateJsonErrorResponse
                   (string *__return_storage_ptr__,JsonErrorCodes code,string *message)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  string local_58;
  JsonErrorCodes local_38 [4];
  pointer local_28;
  size_type sStack_20;
  
  generateJsonQuotedString(&local_58,(string *)message);
  local_28 = local_58._M_dataplus._M_p;
  sStack_20 = local_58._M_string_length;
  fmt.size_ = 0xd1;
  fmt.data_ = (char *)0x37;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  local_38[0] = code;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,
             (v11 *)"{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}",fmt,args);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateJsonErrorResponse(JsonErrorCodes code, const std::string& message)
{
    return fmt::format("{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}",
                       static_cast<std::int32_t>(code),
                       generateJsonQuotedString(message));
}